

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ord_hash_set.h
# Opt level: O2

size_t __thiscall re2c::ord_hash_set_t::insert(ord_hash_set_t *this,void *data,size_t size)

{
  map<unsigned_long,_re2c::ord_hash_set_t::elem_t_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_>_>
  *this_00;
  int iVar1;
  iterator iVar2;
  mapped_type *ppeVar3;
  elem_t *peVar4;
  ord_hash_set_t *this_01;
  _Base_ptr p_Var5;
  hash_t h;
  hash_t local_38;
  
  local_38 = hash(data,size);
  this_00 = &this->lookup;
  iVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>,_std::_Select1st<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_>_>
          ::find(&this_00->_M_t,&local_38);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->lookup)._M_t._M_impl.super__Rb_tree_header) {
LAB_001365f5:
    p_Var5 = (_Base_ptr)
             ((long)(this->elems).
                    super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->elems).
                    super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    this_01 = (ord_hash_set_t *)this_00;
    ppeVar3 = std::
              map<unsigned_long,_re2c::ord_hash_set_t::elem_t_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_>_>
              ::operator[](this_00,&local_38);
    peVar4 = make_elem(this_01,*ppeVar3,(size_t)p_Var5,size,data);
    ppeVar3 = std::
              map<unsigned_long,_re2c::ord_hash_set_t::elem_t_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_>_>
              ::operator[](this_00,&local_38);
    *ppeVar3 = peVar4;
    std::vector<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>::
    push_back(&this->elems,ppeVar3);
  }
  else {
    p_Var5 = (_Base_ptr)&iVar2._M_node[1]._M_parent;
    do {
      do {
        p_Var5 = *(_Base_ptr *)p_Var5;
        if (p_Var5 == (_Base_ptr)0x0) goto LAB_001365f5;
      } while (p_Var5->_M_left != (_Base_ptr)size);
      iVar1 = bcmp(&p_Var5->_M_right,data,size);
    } while (iVar1 != 0);
    p_Var5 = p_Var5->_M_parent;
  }
  return (size_t)p_Var5;
}

Assistant:

size_t ord_hash_set_t::insert(const void *data, size_t size)
{
	const hash_t h = hash(data, size);

	std::map<hash_t, elem_t*>::const_iterator i = lookup.find(h);
	if (i != lookup.end())
	{
		for (elem_t *e = i->second; e; e = e->next)
		{
			if (e->size == size
				&& memcmp(e->data, data, size) == 0)
			{
				return e->index;
			}
		}
	}

	const size_t index = elems.size();
	elems.push_back(lookup[h] = make_elem(lookup[h], index, size, data));
	return index;
}